

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::End(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  
  pIVar2 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if (((GImGui->CurrentWindowStack).Size < 2) &&
     (GImGui->WithinFrameScopeWithImplicitWindow != false)) {
    return;
  }
  if ((pIVar5->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    EndColumns();
  }
  PopClipRect();
  uVar3 = pIVar5->Flags;
  if ((uVar3 >> 0x18 & 1) == 0) {
    LogFinish();
    uVar3 = pIVar5->Flags;
  }
  iVar1 = (pIVar2->CurrentWindowStack).Size;
  iVar4 = iVar1 + -1;
  (pIVar2->CurrentWindowStack).Size = iVar4;
  if ((uVar3 >> 0x1a & 1) != 0) {
    (pIVar2->BeginPopupStack).Size = (pIVar2->BeginPopupStack).Size + -1;
  }
  if (iVar4 == 0) {
    pIVar5 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar5 = (pIVar2->CurrentWindowStack).Data[(long)iVar1 + -2];
  }
  SetCurrentWindow(pIVar5);
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    window->DC.StackSizesOnBegin.CompareWithCurrentState();
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}